

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QPodArrayOps<QTzType>::reallocate
          (QPodArrayOps<QTzType> *this,qsizetype alloc,AllocationOption option)

{
  pair<QTypedArrayData<QTzType>_*,_QTzType_*> pVar1;
  
  pVar1 = QTypedArrayData<QTzType>::reallocateUnaligned
                    ((this->super_QArrayDataPointer<QTzType>).d,
                     (this->super_QArrayDataPointer<QTzType>).ptr,alloc,option);
  if (pVar1.second != (QTzType *)0x0) {
    (this->super_QArrayDataPointer<QTzType>).d = pVar1.first;
    (this->super_QArrayDataPointer<QTzType>).ptr = pVar1.second;
    return;
  }
  qBadAlloc();
}

Assistant:

void reallocate(qsizetype alloc, QArrayData::AllocationOption option)
    {
        auto pair = Data::reallocateUnaligned(this->d, this->ptr, alloc, option);
        Q_CHECK_PTR(pair.second);
        Q_ASSERT(pair.first != nullptr);
        this->d = pair.first;
        this->ptr = pair.second;
    }